

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnStructType
          (SharedValidator *this,Location *param_1,Index field_count,TypeMut *fields)

{
  Index local_5c;
  void *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  StructType local_38;
  
  local_5c = this->num_types_;
  this->num_types_ = local_5c + 1;
  local_58 = (void *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  std::vector<wabt::TypeMut,std::allocator<wabt::TypeMut>>::_M_range_initialize<wabt::TypeMut*>
            ((vector<wabt::TypeMut,std::allocator<wabt::TypeMut>> *)&local_58,fields,
             fields + field_count);
  std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::vector
            (&local_38.fields,(vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&local_58);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,wabt::SharedValidator::StructType>,std::_Select1st<std::pair<unsigned_int_const,wabt::SharedValidator::StructType>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::StructType>>>
  ::_M_emplace_unique<unsigned_int,wabt::SharedValidator::StructType>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,wabt::SharedValidator::StructType>,std::_Select1st<std::pair<unsigned_int_const,wabt::SharedValidator::StructType>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::StructType>>>
              *)&this->struct_types_,&local_5c,&local_38);
  if (local_38.fields.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.fields.
                    super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58);
  }
  return (Result)Ok;
}

Assistant:

Result SharedValidator::OnStructType(const Location&,
                                     Index field_count,
                                     TypeMut* fields) {
  struct_types_.emplace(num_types_++, StructType{TypeMutVector(
                                          &fields[0], &fields[field_count])});
  return Result::Ok;
}